

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O3

crn_header * crnd::crnd_get_header(void *pData,uint32 data_size)

{
  uint uVar1;
  crn_header *pcVar2;
  
  if (((0x49 < data_size && pData != (void *)0x0) && ((ushort)(*pData << 8 | *pData >> 8) == 0x4878)
      ) && (0x49 < (ushort)(*(ushort *)((long)pData + 2) << 8 | *(ushort *)((long)pData + 2) >> 8)))
  {
    uVar1 = *(uint *)((long)pData + 6);
    pcVar2 = (crn_header *)0x0;
    if ((uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18) <=
        data_size) {
      pcVar2 = (crn_header *)pData;
    }
    return pcVar2;
  }
  return (crn_header *)0x0;
}

Assistant:

const crn_header* crnd_get_header(const void* pData, uint32 data_size)
    {
        if ((!pData) || (data_size < sizeof(crn_header)))
            return NULL;

        const crn_header& file_header = *static_cast<const crn_header*>(pData);
        if (file_header.m_sig != crn_header::cCRNSigValue)
            return NULL;

        if ((file_header.m_header_size < sizeof(crn_header)) || (data_size < file_header.m_data_size))
            return NULL;

        return &file_header;
    }